

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O2

void __thiscall
Indexing::CodeTree::optimizeMemoryAfterRemoval
          (CodeTree *this,Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks,CodeOp *removedOp)

{
  pointer ppCVar1;
  CodeOp **ppCVar2;
  ulong uVar3;
  CodeOp **ppCVar4;
  CodeBlock *pCVar5;
  SearchStruct *pSVar6;
  long lVar7;
  pointer *pppCVar8;
  SearchStruct *pSVar9;
  CodeOp *pCVar10;
  SearchStruct *pSVar11;
  long lVar12;
  pointer ppCVar13;
  bool bVar14;
  CodeOp **tgtPtr;
  CodeOp firstOpCopy;
  
  ppCVar2 = firstsInBlocks->_cursor;
  ppCVar4 = ppCVar2 + -1;
  firstsInBlocks->_cursor = ppCVar4;
  pSVar11 = (SearchStruct *)ppCVar2[-1];
  while( true ) {
    for (; (pSVar11 < removedOp &&
           ((((SearchStruct *)removedOp)->landingOp)._alternative == (CodeOp *)0x0));
        removedOp = (CodeOp *)
                    &(((SearchStruct *)((long)removedOp + -0x30))->targets).
                     super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
    }
    if ((SearchStruct *)removedOp != pSVar11) {
      (((SearchStruct *)removedOp)->landingOp)._content = 0;
      return;
    }
    pCVar10 = (pSVar11->landingOp)._alternative;
    if (((ppCVar4 == firstsInBlocks->_stack) && (pCVar10 != (CodeOp *)0x0)) &&
       ((pCVar10->_content & 7) == 6)) {
      (pSVar11->landingOp)._content = 0;
      return;
    }
    pppCVar8 = &pSVar11[-1].targets.
                super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    firstOpCopy._content = (pSVar11->landingOp)._content;
    firstOpCopy._alternative = (pSVar11->landingOp)._alternative;
    if (this->_clauseCodeTree == true) {
      ppCVar13 = *pppCVar8;
      pSVar9 = pSVar11;
      while (bVar14 = ppCVar13 != (pointer)0x0, ppCVar13 = (pointer)((long)ppCVar13 + -1), bVar14) {
        uVar3 = (pSVar9->landingOp)._content;
        if (((uint)uVar3 & 7) == 2) {
          if (7 < uVar3) {
            ILStruct::~ILStruct((ILStruct *)(uVar3 >> 3));
          }
          ILStruct::operator_delete((ILStruct *)(uVar3 >> 3),0x58);
        }
        pSVar9 = (SearchStruct *)&pSVar9->kind;
      }
    }
    Lib::Vector<Indexing::CodeTree::CodeOp>::deallocate
              ((Vector<Indexing::CodeTree::CodeOp> *)pppCVar8);
    ppCVar2 = firstsInBlocks->_cursor;
    if (ppCVar2 == firstsInBlocks->_stack) break;
    ppCVar4 = ppCVar2 + -1;
    firstsInBlocks->_cursor = ppCVar4;
    pSVar9 = (SearchStruct *)ppCVar2[-1];
    pSVar6 = pSVar9;
    if (((pSVar9->landingOp)._content & 7) == 6) {
      if ((SearchStruct *)(pSVar9->landingOp)._alternative == pSVar11) {
        (pSVar9->landingOp)._alternative = pCVar10;
        return;
      }
      SearchStruct::getTargetOpPtr<false>(pSVar9,&firstOpCopy,&tgtPtr);
      *tgtPtr = pCVar10;
      if (pCVar10 != (CodeOp *)0x0) {
        return;
      }
      ppCVar13 = (pSVar9->targets).
                 super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = 0;
      while ((long)(pSVar9->targets).
                   super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar13 >> 3 != lVar7) {
        ppCVar1 = ppCVar13 + lVar7;
        lVar7 = lVar7 + 1;
        if (*ppCVar1 != (CodeOp *)0x0) {
          return;
        }
      }
      pCVar10 = (pSVar9->landingOp)._alternative;
      SearchStruct::destroy(pSVar9);
      ppCVar2 = firstsInBlocks->_cursor;
      ppCVar4 = ppCVar2 + -1;
      firstsInBlocks->_cursor = ppCVar4;
      pSVar6 = (SearchStruct *)ppCVar2[-1];
      pSVar11 = pSVar9;
    }
    ppCVar13 = pSVar6[-1].targets.
               super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    removedOp = (CodeOp *)
                &pSVar6[-1].targets.
                 super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = 0x10;
    do {
      lVar12 = lVar7;
      pppCVar8 = (pointer *)removedOp;
      removedOp = (CodeOp *)(pppCVar8 + 2);
      lVar7 = lVar12 + 0x10;
    } while ((SearchStruct *)pppCVar8[3] != pSVar11);
    pppCVar8[3] = (pointer)pCVar10;
    if (*(ulong *)removedOp != 0 && (*(ulong *)removedOp & 7) == 0) {
      return;
    }
    while (pSVar11 = pSVar6, (long)ppCVar13 << 4 != lVar12) {
      if (*(long *)((long)&(pSVar6->landingOp)._alternative + lVar12) != 0) {
        return;
      }
      uVar3 = *(ulong *)((long)&(pSVar6->landingOp)._content + lVar12);
      lVar12 = lVar12 + 0x10;
      if (uVar3 != 0 && (uVar3 & 7) == 0) {
        return;
      }
    }
  }
  pCVar5 = (CodeBlock *)&pCVar10[-1]._alternative;
  if (pCVar10 == (CodeOp *)0x0) {
    pCVar5 = (CodeBlock *)0x0;
  }
  this->_entryPoint = pCVar5;
  return;
}

Assistant:

void CodeTree::optimizeMemoryAfterRemoval(Stack<CodeOp*>* firstsInBlocks, CodeOp* removedOp)
{
  ASS(removedOp->isFail());
  LOG_OP("Code tree removal memory optimization");
  LOG_OP("firstsInBlocks->size()="<<firstsInBlocks->size());

  //now let us remove unnecessary instructions and the free memory

  CodeOp* op=removedOp;
  ASS(firstsInBlocks->isNonEmpty());
  CodeOp* firstOp=firstsInBlocks->pop();
  for(;;) {
    //firstOp is in a CodeBlock
    ASS(!firstOp->isSearchStruct());
    //op is in the CodeBlock starting at firstOp
    ASS_LE(firstOp, op);
    ASS_G(firstOp+firstOpToCodeBlock(firstOp)->length(), op);

    while(op>firstOp && !op->alternative()) { ASS(!op->isSuccess()); op--; }

    ASS(!op->isSuccess());

    if(op!=firstOp) {
      ASS(op->alternative());
      //we only change the instruction, the alternative must remain unchanged
      op->makeFail();
      return;
    }
    CodeOp* alt=firstOp->alternative();

    CodeBlock* cb=firstOpToCodeBlock(firstOp);

    if(firstsInBlocks->isEmpty() && alt && alt->isSearchStruct()) {
      //We should remove the CodeBlock referenced by _entryPoint, but
      //we cannot replace it by its alternative as it is not a CodeBlock
      //(it's a SearchStruct). Therefore w will not delete it, just set
      //the first operation to fail.
      ASS_EQ(cb,_entryPoint);
      firstOp->makeFail();
      return;
    }

    CodeOp firstOpCopy= *firstOp;

    if(_clauseCodeTree) {
      //delete ILStruct objects
      size_t cbLen=cb->length();
      for(size_t i=0;i<cbLen;i++) {
	if((*cb)[i].isLitEnd()) {
	  delete (*cb)[i].getILS();
	}
      }
    }
    cb->deallocate(); //from now on we mustn't dereference firstOp

    if(firstsInBlocks->isEmpty()) {
      ASS(!alt || !alt->isSearchStruct());
      ASS_EQ(cb,_entryPoint);
      _entryPoint=alt ? firstOpToCodeBlock(alt) : 0;
      return;
    }

    //first operation in the CodeBlock that points to the current one (i.e. cb)
    CodeOp* prevFirstOp=firstsInBlocks->pop();

    if(prevFirstOp->isSearchStruct()) {
      if(prevFirstOp->alternative()==firstOp) {
	//firstOp was an alternative to the SearchStruct
	prevFirstOp->setAlternative(alt);
	return;
      }
      auto ss = prevFirstOp->getSearchStruct();
      CodeOp** tgtPtr;
      ALWAYS(ss->getTargetOpPtr<false>(firstOpCopy, tgtPtr));
      ASS_EQ(*tgtPtr, firstOp);
      *tgtPtr=alt;
      if(alt) {
	ASS( (ss->kind==SearchStruct::FN_STRUCT && alt->isCheckFun()) ||
	    (ss->kind==SearchStruct::GROUND_TERM_STRUCT && alt->isCheckGroundTerm()) );
	return;
      }
      for(size_t i=0; i<ss->length(); i++) {
	if(ss->targets[i]!=0) {
	  //the SearchStruct still contains something, so we won't delete it
	  //TODO: we might want to compress the SearchStruct, if there are too many zeroes
	  return;
	}
      }

      //if we're at this point, the SEARCH_STRUCT will be deleted
      firstOp=&ss->landingOp;
      alt=ss->landingOp.alternative();
      ss->destroy();

      //now let's continue as if there wasn't any SEARCH_STRUCT operation:)

      //the SEARCH_STRUCT is never the first operation in the CodeTree
      ASS(firstsInBlocks->isNonEmpty());
      prevFirstOp=firstsInBlocks->pop();
      //there never are two nested SEARCH_STRUCT operations
      ASS(!prevFirstOp->isSearchStruct());
    }

    CodeBlock* pcb=firstOpToCodeBlock(prevFirstOp);

    //operation that points to the current CodeBlock
    CodeOp* pointingOp=0;

    CodeOp* prevAfterLastOp=prevFirstOp+pcb->length();
    CodeOp* prevOp=prevFirstOp;
    while(prevOp->alternative()!=firstOp) {
      ASS_L(prevOp,prevAfterLastOp);
      prevOp++;
    }
    pointingOp=prevOp;

    pointingOp->setAlternative(alt);
    if(pointingOp->isSuccess()) {
      return;
    }

    prevOp++;
    while(prevOp!=prevAfterLastOp) {
      ASS_NEQ(prevOp->alternative(),firstOp);

      if(prevOp->alternative() || prevOp->isSuccess()) {
	//there is an operation after the pointingOp that cannot be lost
	return;
      }
      prevOp++;
    }

    firstOp=prevFirstOp;
    op=pointingOp;
  }
}